

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprFold(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  int iVar1;
  i64 iVar2;
  i64 iVar3;
  
  if (nArg - 3U < 0xfffffffe) {
    sqlite3_result_error(pCtx,"wrong number of arguments to function fts5_fold",-1);
    return;
  }
  iVar2 = sqlite3VdbeIntValue(*apVal);
  iVar1 = 0;
  if (nArg == 2) {
    iVar3 = sqlite3VdbeIntValue(apVal[1]);
    iVar1 = (int)iVar3;
  }
  iVar1 = sqlite3Fts5UnicodeFold((int)iVar2,iVar1);
  sqlite3_result_int(pCtx,iVar1);
  return;
}

Assistant:

static void fts5ExprFold(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal           /* Function arguments */
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(pCtx, 
        "wrong number of arguments to function fts5_fold", -1
    );
  }else{
    int iCode;
    int bRemoveDiacritics = 0;
    iCode = sqlite3_value_int(apVal[0]);
    if( nArg==2 ) bRemoveDiacritics = sqlite3_value_int(apVal[1]);
    sqlite3_result_int(pCtx, sqlite3Fts5UnicodeFold(iCode, bRemoveDiacritics));
  }
}